

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O3

err_t cmdPrintMem(void *buf,size_t count)

{
  char *dest;
  err_t eVar1;
  
  dest = (char *)blobCreate(0x20);
  if (dest == (char *)0x0) {
    eVar1 = 0x6e;
  }
  else {
    if (0xe < count) {
      do {
        hexFrom(dest,buf,0xe);
        printf("%s",dest);
        buf = (void *)((long)buf + 0xe);
        count = count - 0xe;
      } while (0xe < count);
    }
    hexFrom(dest,buf,count);
    eVar1 = 0;
    printf("%s",dest);
    blobClose(dest);
  }
  return eVar1;
}

Assistant:

err_t cmdPrintMem(const void* buf, size_t count)
{
	char* hex;
	// pre
	ASSERT(memIsValid(buf, count));
	// выделить память
	hex = (char*)blobCreate(32);
	if (!hex)
		return ERR_OUTOFMEMORY;
	// печатать
	while (count > 14)
	{
		hexFrom(hex, buf, 14);
		printf("%s", hex);
		buf = (const octet*)buf + 14, count -= 14;
	}
	hexFrom(hex, buf, count);
	printf("%s", hex);
	// завершить
	blobClose(hex);
	return ERR_OK;
}